

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<signed_char,signed_char,signed_char,duckdb::BinaryLambdaWrapper,bool,signed_char(*)(signed_char,signed_char)>
               (char *ldata,char *rdata,char *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,_func_char_char_char *fun)

{
  bool bVar1;
  char cVar2;
  idx_t iVar3;
  SelectionVector *in_RCX;
  long in_RDX;
  long in_RSI;
  ValidityMask *in_RDI;
  SelectionVector *in_R8;
  ulong in_R9;
  TemplatedValidityMask<unsigned_long> *in_stack_00000008;
  TemplatedValidityMask<unsigned_long> *in_stack_00000010;
  char rentry_1;
  char lentry_1;
  idx_t i_1;
  char rentry;
  char lentry;
  idx_t rindex;
  idx_t lindex;
  idx_t i;
  idx_t in_stack_ffffffffffffff88;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff90;
  ValidityMask *mask;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff98;
  long lVar4;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar5;
  ulong local_58;
  ulong local_38;
  
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000008);
  if ((bVar1) && (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_stack_00000010), bVar1))
  {
    for (local_58 = 0; local_58 < in_R9; local_58 = local_58 + 1) {
      mask = in_RDI;
      iVar3 = SelectionVector::get_index(in_RCX,local_58);
      uVar5 = *(undefined1 *)
               ((long)&(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask + iVar3);
      lVar4 = in_RSI;
      iVar3 = SelectionVector::get_index(in_R8,local_58);
      cVar2 = BinaryLambdaWrapper::
              Operation<signed_char(*)(signed_char,signed_char),bool,signed_char,signed_char,signed_char>
                        ((_func_char_char_char *)
                         CONCAT17(uVar5,CONCAT16(*(undefined1 *)(lVar4 + iVar3),
                                                 in_stack_ffffffffffffffa0)),
                         (char)((ulong)lVar4 >> 0x38),(char)((ulong)lVar4 >> 0x30),mask,
                         in_stack_ffffffffffffff88);
      *(char *)(in_RDX + local_58) = cVar2;
    }
  }
  else {
    for (local_38 = 0; local_38 < in_R9; local_38 = local_38 + 1) {
      SelectionVector::get_index(in_RCX,local_38);
      SelectionVector::get_index(in_R8,local_38);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90);
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_ffffffffffffff98,(idx_t)in_stack_ffffffffffffff90), bVar1)) {
        cVar2 = BinaryLambdaWrapper::
                Operation<signed_char(*)(signed_char,signed_char),bool,signed_char,signed_char,signed_char>
                          ((_func_char_char_char *)
                           CONCAT17(in_stack_ffffffffffffffa7,
                                    CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                           (char)((ulong)in_stack_ffffffffffffff98 >> 0x38),
                           (char)((ulong)in_stack_ffffffffffffff98 >> 0x30),
                           (ValidityMask *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        *(char *)(in_RDX + local_38) = cVar2;
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}